

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockContextEndFrame(ImGuiContext *ctx)

{
  float fVar1;
  long lVar2;
  long lVar3;
  ImDrawList *draw_list;
  ImDrawFlags flags;
  ImGuiContext *g;
  long lVar4;
  long lVar5;
  ImRect bg_rect;
  ImRect local_50;
  ImRect local_40;
  
  if (0 < (ctx->DockContext).Nodes.Data.Size) {
    lVar4 = 8;
    lVar5 = 0;
    do {
      lVar2 = *(long *)((long)&((ctx->DockContext).Nodes.Data.Data)->key + lVar4);
      if ((((lVar2 != 0) && (*(int *)(lVar2 + 0xb0) == ctx->FrameCount)) &&
          ((*(uint *)(lVar2 + 0xc4) >> 9 & 1) != 0)) &&
         (((lVar3 = *(long *)(lVar2 + 0x88), lVar3 != 0 &&
           ((*(uint *)(lVar2 + 0xc4) >> 0xb & 1) == 0)) && (*(long *)(lVar2 + 0x20) == 0)))) {
        fVar1 = (GImGui->Style).FramePadding.y;
        local_50.Min.x = *(float *)(lVar2 + 0x48) + 0.0;
        local_50.Min.y = fVar1 + fVar1 + GImGui->FontSize + *(float *)(lVar2 + 0x4c);
        local_50.Max.x = *(float *)(lVar2 + 0x48) + *(float *)(lVar2 + 0x50);
        local_50.Max.y = *(float *)(lVar2 + 0x4c) + *(float *)(lVar2 + 0x54);
        local_40.Max.x = *(float *)(lVar3 + 0x48) + *(float *)(lVar3 + 0x50);
        local_40.Max.y = *(float *)(lVar3 + 0x4c) + *(float *)(lVar3 + 0x54);
        local_40.Min.x = *(float *)(lVar3 + 0x48);
        local_40.Min.y = *(float *)(lVar3 + 0x4c);
        flags = CalcRoundingFlagsForRectInRect(&local_50,&local_40,2.0);
        draw_list = *(ImDrawList **)(*(long *)(lVar2 + 0x88) + 0x2b8);
        ImDrawListSplitter::SetCurrentChannel(&draw_list->_Splitter,draw_list,0);
        ImDrawList::AddRectFilled
                  (*(ImDrawList **)(*(long *)(lVar2 + 0x88) + 0x2b8),&local_50.Min,&local_50.Max,
                   *(ImU32 *)(lVar2 + 0x80),*(float *)(*(long *)(lVar2 + 0x88) + 0x80),flags);
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (lVar5 < (ctx->DockContext).Nodes.Data.Size);
  }
  return;
}

Assistant:

void ImGui::DockContextEndFrame(ImGuiContext* ctx)
{
    // Draw backgrounds of node missing their window
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc = &g.DockContext;
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
            if (node->LastFrameActive == g.FrameCount && node->IsVisible && node->HostWindow && node->IsLeafNode() && !node->IsBgDrawnThisFrame)
            {
                ImRect bg_rect(node->Pos + ImVec2(0.0f, GetFrameHeight()), node->Pos + node->Size);
                ImDrawFlags bg_rounding_flags = CalcRoundingFlagsForRectInRect(bg_rect, node->HostWindow->Rect(), DOCKING_SPLITTER_SIZE);
                node->HostWindow->DrawList->ChannelsSetCurrent(0);
                node->HostWindow->DrawList->AddRectFilled(bg_rect.Min, bg_rect.Max, node->LastBgColor, node->HostWindow->WindowRounding, bg_rounding_flags);
            }
}